

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKbo.hpp
# Opt level: O3

Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
* __thiscall
Kernel::QKbo::signedAtoms<Kernel::NumTraits<Kernel::RationalConstantType>>
          (Option<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
           *__return_storage_ptr__,QKbo *this,TermList t)

{
  InequalityNormalizer *this_00;
  Self SVar1;
  bool bVar2;
  TermList TVar3;
  TypedTermList term;
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  atoms;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  n;
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_90;
  tuple<Kernel::IntegerConstantType,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
  local_80;
  PolyNf local_60;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_48;
  uint local_38;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_30;
  
  this_00 = (this->_norm).
            super___shared_ptr<Kernel::InequalityNormalizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  TVar3 = AtomicSort::rationalSort();
  term._sort._content = TVar3._content;
  term.super_TermList._content = t._content;
  InequalityNormalizer::normalize(&local_60,this_00,term);
  PolyNf::wrapPoly<Kernel::NumTraits<Kernel::RationalConstantType>>((PolyNf *)&local_38);
  local_48._id = local_38;
  local_48._ptr = local_30;
  divNf<Kernel::NumTraits<Kernel::RationalConstantType>>(&local_80,this,&local_48);
  rmNum<Kernel::NumTraits<Kernel::RationalConstantType>>(&local_90,this,&local_80);
  mpz_clear((__mpz_struct *)
            &local_80.
             super__Tuple_impl<0UL,_Kernel::IntegerConstantType,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_>
             .super__Head_base<0UL,_Kernel::IntegerConstantType,_false>);
  bVar2 = hasSubstitutionProperty
                    (this,(SignedAtoms *)
                          local_90._self._M_t.
                          super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
                          .
                          super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>
                          ._M_head_impl);
  SVar1._M_t.
  super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
  .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>._M_head_impl =
       local_90._self._M_t.
       super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
       .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>._M_head_impl;
  if (!bVar2) {
    *(undefined8 *)
     &__return_storage_ptr__->
      super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
         = 0;
    (__return_storage_ptr__->
    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    )._elem._elem.init._self._M_t.
    super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false> =
         (_Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>)0x0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
             )._elem._elem + 8) = 0;
  }
  else {
    local_90._self._M_t.
    super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>,_true,_true>
          )(__uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
            )0x0;
    (__return_storage_ptr__->
    super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
    )._elem._elem.init._self._M_t.
    super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
    .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false> =
         (_Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>)
         SVar1._M_t.
         super___uniq_ptr_impl<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_std::default_delete<Kernel::WeightedMultiSet<Kernel::SignedTerm>_>_>
         .super__Head_base<0UL,_Kernel::WeightedMultiSet<Kernel::SignedTerm>_*,_false>._M_head_impl;
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._0_1_ = 0;
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[0] = '\0';
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[1] = '\0';
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[2] = '\0';
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[3] = '\0';
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[4] = '\0';
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[5] = '\0';
    local_60.super_PolyNfSuper._inner.
    super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>_>
    .
    super_RawCoproduct<Lib::Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison>,_Kernel::Variable,_Kernel::AnyPoly>
    ._content[6] = '\0';
    Lib::
    Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
    ::~Recycled((Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_60);
  }
  (__return_storage_ptr__->
  super_OptionBase<Lib::Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
  )._isSome = bVar2;
  Lib::
  Recycled<Kernel::WeightedMultiSet<Kernel::SignedTerm>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::~Recycled(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Option<Recycled<SignedAtoms>> signedAtoms(TermList t) const
  {
    auto n = norm().normalize(TypedTermList(t, NumTraits::sort())).template wrapPoly<NumTraits>();
    auto atoms = rmNum(divNf(n));
    if (hasSubstitutionProperty(*atoms)) {
      return Option<decltype(atoms)>(std::move(atoms));
    } else {
      return Option<decltype(atoms)>();
    }
  }